

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::objectivec::StripProto(string *filename)

{
  byte bVar1;
  string *in_RSI;
  string *in_RDI;
  string *in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff38;
  string *str;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  allocator local_91;
  string local_90 [39];
  undefined1 local_69 [56];
  allocator local_31;
  string local_30 [32];
  string *local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,".protodevel",&local_31);
  bVar1 = HasSuffixString((string *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                          in_stack_ffffffffffffff38);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if ((bVar1 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,".proto",&local_91);
    StripSuffixString(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  else {
    str = (string *)local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_69 + 1),".protodevel",(allocator *)str);
    StripSuffixString(str,local_10);
    std::__cxx11::string::~string((string *)(local_69 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_69);
  }
  return in_RDI;
}

Assistant:

string StripProto(const string& filename) {
  if (HasSuffixString(filename, ".protodevel")) {
    return StripSuffixString(filename, ".protodevel");
  } else {
    return StripSuffixString(filename, ".proto");
  }
}